

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

int CVodeGetSensDky(void *cvode_mem,sunrealtype t,int k,N_Vector *dkyS)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  long lVar2;
  int iVar3;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar3 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0xfe8;
  }
  else {
    if (dkyS != (N_Vector *)0x0) {
      if (0 < *(int *)((long)cvode_mem + 0x90)) {
        lVar2 = 0;
        do {
          iVar1 = CVodeGetSensDky1(cvode_mem,t,k,(int)lVar2,dkyS[lVar2]);
          if (iVar1 != 0) {
            return iVar1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < *(int *)((long)cvode_mem + 0x90));
      }
      return 0;
    }
    msgfmt = "dkyA = NULL illegal.";
    iVar3 = -0x1a;
    error_code = -0x1a;
    iVar1 = 0xff1;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar1,"CVodeGetSensDky",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar3;
}

Assistant:

int CVodeGetSensDky(void* cvode_mem, sunrealtype t, int k, N_Vector* dkyS)
{
  int ier = CV_SUCCESS;
  int is;
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  if (dkyS == NULL)
  {
    cvProcessError(cv_mem, CV_BAD_DKY, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_DKYA);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_DKY);
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    ier = CVodeGetSensDky1(cvode_mem, t, k, is, dkyS[is]);
    if (ier != CV_SUCCESS) { break; }
  }

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (ier);
}